

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O3

optional<tinyusdz::Token> * __thiscall
tinyusdz::primvar::PrimVar::get_ts_value<tinyusdz::Token>
          (optional<tinyusdz::Token> *__return_storage_ptr__,PrimVar *this,size_t idx)

{
  undefined4 *puVar1;
  bool bVar2;
  storage_union local_50;
  long local_40;
  optional<tinyusdz::Token> local_38;
  
  if ((this->_ts)._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->_ts)._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __return_storage_ptr__->has_value_ = false;
    *(undefined8 *)&__return_storage_ptr__->contained = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
  }
  else {
    tinyusdz::value::TimeSamples::get_value
              ((optional<tinyusdz::value::Value> *)&local_38,&this->_ts,idx);
    bVar2 = local_38.has_value_;
    if ((local_38.has_value_ == true) &&
       (local_40 = local_38.contained._16_8_, local_38.contained._16_8_ != 0)) {
      (**(code **)(local_38.contained._16_8_ + 0x30))(&local_38.contained,&local_50);
      local_38.contained._16_8_ = 0;
    }
    if (((local_38.has_value_ & 1U) != 0) && (local_38.contained._16_8_ != 0)) {
      (**(code **)(local_38.contained._16_8_ + 0x20))(&local_38.contained);
    }
    if (bVar2 == false) {
      __return_storage_ptr__->has_value_ = false;
      *(undefined8 *)&__return_storage_ptr__->contained = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
    }
    else {
      tinyusdz::value::Value::get_value<tinyusdz::Token>(&local_38,(Value *)&local_50,false);
      __return_storage_ptr__->has_value_ = local_38.has_value_;
      if (local_38.has_value_ == true) {
        puVar1 = (undefined4 *)((long)&__return_storage_ptr__->contained + 0x10);
        *(undefined4 **)&__return_storage_ptr__->contained = puVar1;
        if (local_38.contained.data.__align ==
            (anon_struct_8_0_00000001_for___align)((long)&local_38.contained + 0x10)) {
          *puVar1 = local_38.contained._16_4_;
          *(undefined4 *)((long)&__return_storage_ptr__->contained + 0x14) =
               local_38.contained._20_4_;
          *(undefined4 *)((long)&__return_storage_ptr__->contained + 0x18) =
               local_38.contained._24_4_;
          *(undefined4 *)((long)&__return_storage_ptr__->contained + 0x1c) =
               local_38.contained._28_4_;
        }
        else {
          *(anon_struct_8_0_00000001_for___align *)&__return_storage_ptr__->contained =
               local_38.contained.data.__align;
          *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) =
               local_38.contained._16_8_;
        }
        *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = local_38.contained._8_8_;
      }
    }
    if (((bVar2 & 1U) != 0) && (local_40 != 0)) {
      (**(code **)(local_40 + 0x20))(&local_50);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_ts_value(size_t idx) const {

    if (!has_timesamples()) {
      return nonstd::nullopt;
    }

    nonstd::optional<value::Value> pv = _ts.get_value(idx);
    if (!pv) {
      return nonstd::nullopt;
    }

    return pv.value().get_value<T>();
  }